

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O2

ClusterIndex __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::AddTransaction
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,FeeFrac *feefrac)

{
  long lVar1;
  long in_FS_OFFSET;
  IntBitSet<unsigned_int> local_18;
  IntBitSet<unsigned_int> local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = ((long)(this->entries).
                 super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->entries).
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_18.m_val = 1 << ((byte)lVar1 & 0x1f);
  local_14.m_val = local_18.m_val;
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry,std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry>>
  ::
  emplace_back<FeeFrac_const&,bitset_detail::IntBitSet<unsigned_int>,bitset_detail::IntBitSet<unsigned_int>>
            ((vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry,std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>::Entry>>
              *)this,feefrac,&local_14,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (ClusterIndex)lVar1;
  }
  __stack_chk_fail();
}

Assistant:

ClusterIndex AddTransaction(const FeeFrac& feefrac) noexcept
    {
        Assume(TxCount() < SetType::Size());
        ClusterIndex new_idx = TxCount();
        entries.emplace_back(feefrac, SetType::Singleton(new_idx), SetType::Singleton(new_idx));
        return new_idx;
    }